

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall slang::ast::Compilation::addGateType(Compilation *this,PrimitiveSymbol *prim)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  uint uVar6;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  uint64_t hash;
  ulong uVar10;
  string_view *sv;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong pos0;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  try_emplace_args_t local_a1;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_a0;
  PrimitiveSymbol *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  uint64_t local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator res;
  
  local_a0 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)&this->gateMap;
  sv = &(prim->super_Symbol).name;
  local_98 = prim;
  hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                   ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_a0,sv
                   );
  this_00 = local_a0;
  uVar13 = hash >> ((byte)(this->gateMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
                          .arrays.groups_size_index & 0x3f);
  lVar11 = (hash & 0xff) * 4;
  uVar15 = (&UNK_0048f58c)[lVar11];
  uVar16 = (&UNK_0048f58d)[lVar11];
  uVar17 = (&UNK_0048f58e)[lVar11];
  bVar18 = (&UNK_0048f58f)[lVar11];
  uVar12 = (ulong)((uint)hash & 7);
  uVar10 = 0;
  pos0 = uVar13;
  uVar19 = uVar15;
  uVar20 = uVar16;
  uVar21 = uVar17;
  bVar22 = bVar18;
  uVar23 = uVar15;
  uVar24 = uVar16;
  uVar25 = uVar17;
  bVar26 = bVar18;
  uVar27 = uVar15;
  uVar28 = uVar16;
  uVar29 = uVar17;
  bVar30 = bVar18;
  do {
    pgVar3 = (this->gateMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
             .arrays.groups_;
    pgVar2 = pgVar3 + uVar13;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bVar8 = pgVar2->m[0xf].n;
    auVar14[0] = -(local_58 == uVar15);
    auVar14[1] = -(uStack_57 == uVar16);
    auVar14[2] = -(uStack_56 == uVar17);
    auVar14[3] = -(bStack_55 == bVar18);
    auVar14[4] = -(uStack_54 == uVar19);
    auVar14[5] = -(uStack_53 == uVar20);
    auVar14[6] = -(uStack_52 == uVar21);
    auVar14[7] = -(bStack_51 == bVar22);
    auVar14[8] = -(uStack_50 == uVar23);
    auVar14[9] = -(uStack_4f == uVar24);
    auVar14[10] = -(uStack_4e == uVar25);
    auVar14[0xb] = -(bStack_4d == bVar26);
    auVar14[0xc] = -(uStack_4c == uVar27);
    auVar14[0xd] = -(uStack_4b == uVar28);
    auVar14[0xe] = -(uStack_4a == uVar29);
    auVar14[0xf] = -(bVar8 == bVar30);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar8;
    if (uVar9 != 0) {
      ppVar4 = (this->gateMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
               .arrays.elements_;
      local_90 = pos0;
      local_88 = uVar12;
      local_80 = uVar13;
      local_78 = uVar10;
      local_70 = hash;
      local_68 = uVar15;
      uStack_67 = uVar16;
      uStack_66 = uVar17;
      bStack_65 = bVar18;
      uStack_64 = uVar19;
      uStack_63 = uVar20;
      uStack_62 = uVar21;
      bStack_61 = bVar22;
      uStack_60 = uVar23;
      uStack_5f = uVar24;
      uStack_5e = uVar25;
      bStack_5d = bVar26;
      uStack_5c = uVar27;
      uStack_5b = uVar28;
      uStack_5a = uVar29;
      bStack_59 = bVar30;
      do {
        uVar6 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          (this_00,sv,&ppVar4[uVar13 * 0xf + (ulong)uVar6].first);
        if (bVar7) {
          return;
        }
        uVar9 = uVar9 - 1 & uVar9;
      } while (uVar9 != 0);
      bVar8 = pgVar3[uVar13].m[0xf].n;
      uVar10 = local_78;
      uVar13 = local_80;
      hash = local_70;
      uVar12 = local_88;
      pos0 = local_90;
      uVar15 = local_68;
      uVar16 = uStack_67;
      uVar17 = uStack_66;
      bVar18 = bStack_65;
      uVar19 = uStack_64;
      uVar20 = uStack_63;
      uVar21 = uStack_62;
      bVar22 = bStack_61;
      uVar23 = uStack_60;
      uVar24 = uStack_5f;
      uVar25 = uStack_5e;
      bVar26 = bStack_5d;
      uVar27 = uStack_5c;
      uVar28 = uStack_5b;
      uVar29 = uStack_5a;
      bVar30 = bStack_59;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar12] & bVar8) == 0) break;
    uVar5 = (this->gateMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
            .arrays.groups_size_mask;
    lVar11 = uVar13 + uVar10;
    uVar10 = uVar10 + 1;
    uVar13 = lVar11 + 1U & uVar5;
  } while (uVar10 <= uVar5);
  if ((this->gateMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
      .size_ctrl.size <
      (this->gateMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PrimitiveSymbol_const*>
              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
                     *)local_a0,(arrays_type *)local_a0,pos0,hash,&local_a1,sv,&local_98);
    psVar1 = &(this->gateMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PrimitiveSymbol_const*>
              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
                     *)local_a0,hash,&local_a1,sv,&local_98);
  }
  return;
}

Assistant:

void Compilation::addGateType(const PrimitiveSymbol& prim) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(!prim.name.empty());
    gateMap.emplace(prim.name, &prim);
}